

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O0

void __thiscall wabt::AST::Construct(AST *this,Expr *e)

{
  LabelType LVar1;
  ModuleContext *pMVar2;
  bool bVar3;
  ExprType EVar4;
  Index IVar5;
  VarExpr<(wabt::ExprType)22> *ve;
  VarExpr<(wabt::ExprType)18> *ve_00;
  VarExpr<(wabt::ExprType)23> *ve_01;
  VarExpr<(wabt::ExprType)19> *ve_02;
  VarExpr<(wabt::ExprType)24> *ve_03;
  IfExpr *pIVar6;
  BlockExprBase<(wabt::ExprType)7> *be;
  BlockExprBase<(wabt::ExprType)25> *be_00;
  VarExpr<(wabt::ExprType)8> *pVVar7;
  VarExpr<(wabt::ExprType)9> *pVVar8;
  Label *pLVar9;
  Node *pNVar10;
  Arities AVar11;
  IfExpr *ife;
  VarExpr<(wabt::ExprType)24> *lt;
  Index local_28;
  Arities arity;
  Expr *e_local;
  AST *this_local;
  
  AVar11 = ModuleContext::GetExprArity(this->mc,e);
  EVar4 = Expr::type(e);
  switch(EVar4) {
  case Block:
    be = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(e);
    Block<(wabt::ExprType)7>(this,be,Block);
    break;
  case Br:
    pMVar2 = this->mc;
    pVVar7 = cast<wabt::VarExpr<(wabt::ExprType)8>,wabt::Expr>(e);
    pLVar9 = ModuleContext::GetLabel(pMVar2,&pVVar7->var);
    LVar1 = pLVar9->label_type;
    pNVar10 = InsertNode(this,Expr,Br,e,0);
    (pNVar10->u).field_0.var_start = LVar1;
    break;
  case BrIf:
    pMVar2 = this->mc;
    pVVar8 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(e);
    pLVar9 = ModuleContext::GetLabel(pMVar2,&pVVar8->var);
    LVar1 = pLVar9->label_type;
    pNVar10 = InsertNode(this,Expr,BrIf,e,1);
    (pNVar10->u).field_0.var_start = LVar1;
    break;
  default:
    EVar4 = Expr::type(e);
    local_28 = AVar11.nargs;
    InsertNode(this,Expr,EVar4,e,local_28);
    break;
  case GlobalGet:
    ve_00 = cast<wabt::VarExpr<(wabt::ExprType)18>,wabt::Expr>(e);
    Get<(wabt::ExprType)18>(this,ve_00,false);
    break;
  case GlobalSet:
    ve_02 = cast<wabt::VarExpr<(wabt::ExprType)19>,wabt::Expr>(e);
    Set<(wabt::ExprType)19>(this,ve_02,false);
    break;
  case If:
    pIVar6 = cast<wabt::IfExpr,wabt::Expr>(e);
    this->value_stack_depth = this->value_stack_depth + -1;
    ModuleContext::BeginBlock(this->mc,Block,&pIVar6->true_);
    IVar5 = FuncDeclaration::GetNumResults(&(pIVar6->true_).decl);
    Construct(this,&(pIVar6->true_).exprs,IVar5,false);
    bVar3 = intrusive_list<wabt::Expr>::empty(&pIVar6->false_);
    if (!bVar3) {
      IVar5 = FuncDeclaration::GetNumResults(&(pIVar6->true_).decl);
      Construct(this,&pIVar6->false_,IVar5,false);
    }
    ModuleContext::EndBlock(this->mc);
    this->value_stack_depth = this->value_stack_depth + 1;
    bVar3 = intrusive_list<wabt::Expr>::empty(&pIVar6->false_);
    IVar5 = 3;
    if (bVar3) {
      IVar5 = 2;
    }
    InsertNode(this,Expr,If,e,IVar5);
    break;
  case LocalGet:
    ve = cast<wabt::VarExpr<(wabt::ExprType)22>,wabt::Expr>(e);
    Get<(wabt::ExprType)22>(this,ve,true);
    break;
  case LocalSet:
    ve_01 = cast<wabt::VarExpr<(wabt::ExprType)23>,wabt::Expr>(e);
    Set<(wabt::ExprType)23>(this,ve_01,true);
    break;
  case LocalTee:
    ve_03 = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(e);
    Set<(wabt::ExprType)24>(this,ve_03,true);
    if (this->value_stack_depth == 1) {
      Get<(wabt::ExprType)24>(this,ve_03,true);
    }
    break;
  case Loop:
    be_00 = cast<wabt::BlockExprBase<(wabt::ExprType)25>,wabt::Expr>(e);
    Block<(wabt::ExprType)25>(this,be_00,Loop);
  }
  return;
}

Assistant:

void Construct(const Expr& e) {
    auto arity = mc.GetExprArity(e);
    switch (e.type()) {
      case ExprType::LocalGet: {
        Get(*cast<LocalGetExpr>(&e), true);
        return;
      }
      case ExprType::GlobalGet: {
        Get(*cast<GlobalGetExpr>(&e), false);
        return;
      }
      case ExprType::LocalSet: {
        Set(*cast<LocalSetExpr>(&e), true);
        return;
      }
      case ExprType::GlobalSet: {
        Set(*cast<GlobalSetExpr>(&e), false);
        return;
      }
      case ExprType::LocalTee: {
        auto& lt = *cast<LocalTeeExpr>(&e);
        Set(lt, true);
        if (value_stack_depth == 1) {  // Tee is the only thing on there.
          Get(lt, true);  // Now Set + Get instead.
        } else {
          // Things are above us on the stack so the Tee can't be eliminated.
          // The Set makes this work as a Tee when consumed by a parent.
        }
        return;
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(&e);
        value_stack_depth--;  // Condition.
        mc.BeginBlock(LabelType::Block, ife->true_);
        Construct(ife->true_.exprs, ife->true_.decl.GetNumResults(), false);
        if (!ife->false_.empty()) {
          Construct(ife->false_, ife->true_.decl.GetNumResults(), false);
        }
        mc.EndBlock();
        value_stack_depth++;  // Put Condition back.
        InsertNode(NodeType::Expr, ExprType::If, &e, ife->false_.empty() ? 2 : 3);
        return;
      }
      case ExprType::Block: {
        Block(*cast<BlockExpr>(&e), LabelType::Block);
        return;
      }
      case ExprType::Loop: {
        Block(*cast<LoopExpr>(&e), LabelType::Loop);
        return;
      }
      case ExprType::Br: {
        InsertNode(NodeType::Expr, ExprType::Br, &e, 0).u.lt =
            mc.GetLabel(cast<BrExpr>(&e)->var)->label_type;
        return;
      }
      case ExprType::BrIf: {
        InsertNode(NodeType::Expr, ExprType::BrIf, &e, 1).u.lt =
            mc.GetLabel(cast<BrIfExpr>(&e)->var)->label_type;
        return;
      }
      default: {
        InsertNode(NodeType::Expr, e.type(), &e, arity.nargs);
        return;
      }
    }
  }